

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

value_type __thiscall
FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
::dx(FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
     *this,int i)

{
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar2;
  value_type vVar3;
  double dVar4;
  
  vVar3 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
          ::dx((FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                *)&this->fadexpr_,i);
  pFVar1 = (this->fadexpr_).expr_.fadexpr_.left_;
  pFVar2 = (this->fadexpr_).expr_.fadexpr_.right_;
  dVar4 = ((pFVar2->fadexpr_).left_)->val_ * ((pFVar2->fadexpr_).right_)->val_ +
          ((pFVar1->fadexpr_).left_)->val_ * ((pFVar1->fadexpr_).right_)->val_;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  return vVar3 / (dVar4 + dVar4);
}

Assistant:

value_type dx(int i) const { return fadexpr_.dx(i);}